

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

bool __thiscall
SoftHSM::setECPrivateKey(SoftHSM *this,OSObject *key,ByteString *ber,Token *token,bool isPrivate)

{
  Token *this_00;
  long *plVar1;
  byte bVar2;
  int iVar3;
  CryptoFactory *pCVar4;
  undefined4 extraout_var;
  ulong uVar5;
  char *pcVar6;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  undefined8 in_RDX;
  long *in_RSI;
  byte in_R8B;
  bool bVar7;
  bool bOK;
  ByteString value;
  ByteString group;
  PrivateKey *priv;
  AsymmetricAlgorithm *ecc;
  ByteString *in_stack_fffffffffffffda8;
  OSAttribute *in_stack_fffffffffffffdb0;
  byte local_232;
  uint7 in_stack_fffffffffffffdd8;
  OSAttribute *in_stack_fffffffffffffde0;
  undefined1 local_1e8 [167];
  byte local_141;
  undefined1 local_140 [163];
  byte local_9d;
  undefined1 local_90 [40];
  undefined1 local_68 [40];
  long *local_40;
  long *local_38;
  byte local_29;
  Token *local_28;
  undefined8 local_20;
  long *local_18;
  byte local_1;
  
  local_28 = (Token *)CONCAT71(in_register_00000009,in_CL);
  local_29 = in_R8B & 1;
  local_20 = in_RDX;
  local_18 = in_RSI;
  pCVar4 = CryptoFactory::i();
  iVar3 = (*pCVar4->_vptr_CryptoFactory[2])(pCVar4,5);
  local_38 = (long *)CONCAT44(extraout_var,iVar3);
  if (local_38 == (long *)0x0) {
    local_1 = 0;
  }
  else {
    local_40 = (long *)(**(code **)(*local_38 + 0xb0))();
    if (local_40 == (long *)0x0) {
      pCVar4 = CryptoFactory::i();
      (*pCVar4->_vptr_CryptoFactory[3])(pCVar4,local_38);
      local_1 = 0;
    }
    else {
      uVar5 = (**(code **)(*local_40 + 0x38))(local_40,local_20);
      if ((uVar5 & 1) == 0) {
        (**(code **)(*local_38 + 0xd8))(local_38,local_40);
        pCVar4 = CryptoFactory::i();
        (*pCVar4->_vptr_CryptoFactory[3])(pCVar4,local_38);
        local_1 = 0;
      }
      else {
        ByteString::ByteString((ByteString *)0x18d380);
        ByteString::ByteString((ByteString *)0x18d38d);
        this_00 = local_28;
        if ((local_29 & 1) == 0) {
          (**(code **)(*local_40 + 0x60))();
          ByteString::operator=((ByteString *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
          in_stack_fffffffffffffde0 = (OSAttribute *)(**(code **)(*local_40 + 0x58))();
          ByteString::operator=((ByteString *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
        }
        else {
          pcVar6 = (char *)(**(code **)(*local_40 + 0x60))();
          Token::encrypt(this_00,pcVar6,(int)local_68);
          pcVar6 = (char *)(**(code **)(*local_40 + 0x58))();
          Token::encrypt(local_28,pcVar6,(int)local_90);
        }
        plVar1 = local_18;
        local_9d = 1;
        local_141 = 0;
        OSAttribute::OSAttribute
                  (in_stack_fffffffffffffde0,(ByteString *)(ulong)in_stack_fffffffffffffdd8);
        local_141 = 1;
        bVar2 = (**(code **)(*plVar1 + 0x40))(plVar1,0x180,local_140);
        local_9d = bVar2 & 1;
        if ((local_141 & 1) != 0) {
          OSAttribute::~OSAttribute(in_stack_fffffffffffffdb0);
        }
        bVar7 = (local_9d & 1) != 0;
        local_232 = 0;
        if (bVar7) {
          OSAttribute::OSAttribute
                    (in_stack_fffffffffffffde0,
                     (ByteString *)CONCAT17(bVar2,in_stack_fffffffffffffdd8));
          local_232 = (**(code **)(*local_18 + 0x40))(local_18,0x11,local_1e8);
        }
        local_9d = local_232 & 1;
        if (bVar7) {
          OSAttribute::~OSAttribute(in_stack_fffffffffffffdb0);
        }
        (**(code **)(*local_38 + 0xd8))(local_38,local_40);
        pCVar4 = CryptoFactory::i();
        (*pCVar4->_vptr_CryptoFactory[3])(pCVar4,local_38);
        local_1 = local_9d & 1;
        ByteString::~ByteString((ByteString *)0x18d62d);
        ByteString::~ByteString((ByteString *)0x18d63a);
      }
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool SoftHSM::setECPrivateKey(OSObject* key, const ByteString &ber, Token* token, bool isPrivate) const
{
	AsymmetricAlgorithm* ecc = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::ECDSA);
	if (ecc == NULL)
		return false;
	PrivateKey* priv = ecc->newPrivateKey();
	if (priv == NULL)
	{
		CryptoFactory::i()->recycleAsymmetricAlgorithm(ecc);
		return false;
	}
	if (!priv->PKCS8Decode(ber))
	{
		ecc->recyclePrivateKey(priv);
		CryptoFactory::i()->recycleAsymmetricAlgorithm(ecc);
		return false;
	}
	// EC Private Key Attributes
	ByteString group;
	ByteString value;
	if (isPrivate)
	{
		token->encrypt(((ECPrivateKey*)priv)->getEC(), group);
		token->encrypt(((ECPrivateKey*)priv)->getD(), value);
	}
	else
	{
		group = ((ECPrivateKey*)priv)->getEC();
		value = ((ECPrivateKey*)priv)->getD();
	}
	bool bOK = true;
	bOK = bOK && key->setAttribute(CKA_EC_PARAMS, group);
	bOK = bOK && key->setAttribute(CKA_VALUE, value);

	ecc->recyclePrivateKey(priv);
	CryptoFactory::i()->recycleAsymmetricAlgorithm(ecc);

	return bOK;
}